

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_value_constructor_multiset_Test::ObjectTest_basic_value_constructor_multiset_Test
          (ObjectTest_basic_value_constructor_multiset_Test *this)

{
  ObjectTest_basic_value_constructor_multiset_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_value_constructor_multiset_Test_0080fa08;
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_multiset) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::multiset<object>);
}